

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<unsigned_char,short>(void)

{
  char cVar1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  undefined8 in_RAX;
  uchar ret;
  undefined8 local_18;
  
  local_18 = CONCAT44((int)((ulong)in_RAX >> 0x20),0x10001);
  local_18 = CONCAT62(local_18._2_6_,1);
  DivisionHelper<unsigned_char,short,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((uchar *)&local_18,(short *)((long)&local_18 + 2),(uchar *)((long)&local_18 + 1));
  operator/(1,local_18._0_1_);
  local_18._0_6_ = CONCAT24(1,(undefined4)local_18);
  DivisionHelper<unsigned_char,short,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((uchar *)&local_18,(short *)((long)&local_18 + 4),(uchar *)&local_18);
  local_18 = CONCAT26(1,(undefined6)local_18);
  DivisionHelper<unsigned_char,short,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((uchar *)&local_18,(short *)((long)&local_18 + 6),(uchar *)&local_18);
  if (((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
       )local_18._0_1_ !=
       (SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
       )0xff) &&
     (cVar1 = local_18._0_1_ + '\x01', local_18 = CONCAT71(local_18._1_7_,cVar1), cVar1 != -1)) {
    local_18 = (ulong)local_18._1_7_ << 8;
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_18,1);
    SVar2 = SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator<<((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                          *)&local_18,
                         (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x1);
    operator<<(SVar2.m_int,
               (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )0x1);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_18,1);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_18,
                (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 )0x1);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_18,1);
    SVar2 = SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator>>((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                          *)&local_18,
                         (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x1);
    operator>>(SVar2.m_int,
               (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )0x1);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_18,1);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_18,
                (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 )0x1);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}